

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_vcodec_client.c
# Opt level: O2

MPP_RET mpp_vcodec_ioctl(RK_S32 fd,RK_U32 cmd,RK_U32 ctrl_cmd,RK_U32 size,void *param)

{
  uint __errnum;
  uint uVar1;
  uint *puVar2;
  char *pcVar3;
  MPP_RET MVar4;
  RK_U32 local_30;
  RK_U32 local_2c;
  ulong local_28;
  void *local_20;
  
  local_28 = (ulong)size;
  MVar4 = MPP_OK;
  local_30 = cmd;
  local_2c = ctrl_cmd;
  local_20 = param;
  uVar1 = ioctl(fd,0x40045601,&local_30);
  if (uVar1 != 0) {
    puVar2 = (uint *)__errno_location();
    __errnum = *puVar2;
    pcVar3 = strerror(__errnum);
    _mpp_log_l(2,"mpp_vcodec","ioctl fd %d failed ret %d errno %d %s\n",(char *)0x0,fd,(ulong)uVar1,
               (ulong)__errnum,pcVar3);
    MVar4 = MPP_NOK;
  }
  return MVar4;
}

Assistant:

MPP_RET mpp_vcodec_ioctl(RK_S32 fd, RK_U32 cmd, RK_U32 ctrl_cmd, RK_U32 size, void *param)
{
    vcodec_req req;
    RK_S32 ret = 0;

    memset(&req, 0, sizeof(req));
    req.cmd = cmd;
    req.ctrl_cmd = ctrl_cmd;
    req.size = size;
    req.data = REQ_DATA_PTR(param);

    ret = (RK_S32)ioctl(fd, VOCDEC_IOC_CFG, &req);
    if (ret) {
        mpp_err("ioctl fd %d failed ret %d errno %d %s\n",
                fd, ret, errno, strerror(errno));
        return MPP_NOK;
    }

    return MPP_OK;
}